

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *coScaleVal,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  double __x;
  DataArray<int> *pDVar2;
  bool bVar3;
  type_conflict5 tVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  Item *pIVar5;
  int j;
  long lVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<50U,_int,_void> local_1c8;
  cpp_dec_float<50U,_int,_void> local_188;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_148;
  DataArray<int> *local_140;
  long local_138;
  double local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_138 = 0;
  local_148 = vecset;
  local_140 = scaleExp;
  while (local_138 < (local_148->set).thenum) {
    pIVar5 = (local_148->set).theitem + (local_148->set).thekey[local_138].idx;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_188,0.0,(type *)0x0);
    lVar7 = 0;
    for (lVar6 = 0;
        lVar6 < (pIVar5->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused; lVar6 = lVar6 + 1) {
      pNVar1 = (pIVar5->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      local_68.fpclass = cpp_dec_float_finite;
      local_68.prec_elem = 10;
      local_68.data._M_elems[0] = 0;
      local_68.data._M_elems[1] = 0;
      local_68.data._M_elems[2] = 0;
      local_68.data._M_elems[3] = 0;
      local_68.data._M_elems[4] = 0;
      local_68.data._M_elems[5] = 0;
      local_68.data._M_elems._24_5_ = 0;
      local_68.data._M_elems[7]._1_3_ = 0;
      local_68.data._M_elems._32_5_ = 0;
      local_68._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_68,
                 (cpp_dec_float<50U,_int,_void> *)((long)&(pNVar1->val).m_backend.data + lVar7),
                 &(coScaleVal->
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [*(uint *)((long)(&pNVar1->val + 1) + lVar7)].m_backend);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)&local_1c8,(multiprecision *)&local_68,arg);
      local_a8.m_backend.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
      local_a8.m_backend.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
      local_a8.m_backend.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
      local_a8.m_backend.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
      local_a8.m_backend.data._M_elems[4] = local_1c8.data._M_elems[4];
      local_a8.m_backend.data._M_elems[5] = local_1c8.data._M_elems[5];
      local_a8.m_backend.data._M_elems[0] = local_1c8.data._M_elems[0];
      local_a8.m_backend.data._M_elems[1] = local_1c8.data._M_elems[1];
      local_a8.m_backend.data._M_elems[2] = local_1c8.data._M_elems[2];
      local_a8.m_backend.data._M_elems[3] = local_1c8.data._M_elems[3];
      local_a8.m_backend.exp = local_1c8.exp;
      local_a8.m_backend.neg = local_1c8.neg;
      local_a8.m_backend.fpclass = local_1c8.fpclass;
      local_a8.m_backend.prec_elem = local_1c8.prec_elem;
      local_e8.m_backend.data._M_elems[0] = local_188.data._M_elems[0];
      local_e8.m_backend.data._M_elems[1] = local_188.data._M_elems[1];
      local_e8.m_backend.data._M_elems[2] = local_188.data._M_elems[2];
      local_e8.m_backend.data._M_elems[3] = local_188.data._M_elems[3];
      local_e8.m_backend.data._M_elems[4] = local_188.data._M_elems[4];
      local_e8.m_backend.data._M_elems[5] = local_188.data._M_elems[5];
      local_e8.m_backend.data._M_elems[6] = local_188.data._M_elems[6];
      local_e8.m_backend.data._M_elems[7] = local_188.data._M_elems[7];
      local_e8.m_backend.data._M_elems[8] = local_188.data._M_elems[8];
      local_e8.m_backend.data._M_elems[9] = local_188.data._M_elems[9];
      local_e8.m_backend.exp = local_188.exp;
      local_e8.m_backend.neg = local_188.neg;
      local_e8.m_backend.fpclass = local_188.fpclass;
      local_e8.m_backend.prec_elem = local_188.prec_elem;
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
      local_128.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
      local_128.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
      local_128.m_backend.exp = (epsilon->m_backend).exp;
      local_128.m_backend.neg = (epsilon->m_backend).neg;
      local_128.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_128.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      bVar3 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_a8,&local_e8,&local_128);
      if (bVar3) {
        local_188.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
        local_188.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
        local_188.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
        local_188.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
        local_188.data._M_elems[4] = local_1c8.data._M_elems[4];
        local_188.data._M_elems[5] = local_1c8.data._M_elems[5];
        local_188.data._M_elems[0] = local_1c8.data._M_elems[0];
        local_188.data._M_elems[1] = local_1c8.data._M_elems[1];
        local_188.data._M_elems[2] = local_1c8.data._M_elems[2];
        local_188.data._M_elems[3] = local_1c8.data._M_elems[3];
        local_188.exp = local_1c8.exp;
        local_188.neg = local_1c8.neg;
        local_188.fpclass = local_1c8.fpclass;
        local_188.prec_elem = local_1c8.prec_elem;
      }
      lVar7 = lVar7 + 0x3c;
    }
    local_1c8.data._M_elems[0] = 0;
    local_1c8.data._M_elems[1] = 0;
    tVar4 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_188,(double *)&local_1c8);
    if (tVar4) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_188,1.0);
    }
    local_130 = 1.0;
    local_1c8.fpclass = cpp_dec_float_finite;
    local_1c8.prec_elem = 10;
    local_1c8.data._M_elems[0] = 0;
    local_1c8.data._M_elems[1] = 0;
    local_1c8.data._M_elems[2] = 0;
    local_1c8.data._M_elems[3] = 0;
    local_1c8.data._M_elems[4] = 0;
    local_1c8.data._M_elems[5] = 0;
    local_1c8.data._M_elems._24_5_ = 0;
    local_1c8.data._M_elems[7]._1_3_ = 0;
    local_1c8.data._M_elems._32_5_ = 0;
    local_1c8.data._M_elems[9]._1_3_ = 0;
    local_1c8.exp = 0;
    local_1c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&local_1c8,&local_130,&local_188);
    __x = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double(&local_1c8)
    ;
    lVar6 = local_138;
    pDVar2 = local_140;
    frexp(__x,local_140->data + local_138);
    pDVar2->data[lVar6] = pDVar2->data[lVar6] + -1;
    local_138 = lVar6 + 1;
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const std::vector<R>& coScaleVal,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j) * coScaleVal[unsigned(vec.index(j))]);

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}